

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

void CMakeCommandUsage(char *program)

{
  char *__s;
  size_t sVar1;
  ostringstream errorStream;
  string local_1a8;
  undefined1 local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"cmake version ",0xe);
  __s = cmVersion::GetCMakeVersion();
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_1a8 + (int)*(_func_int **)(local_188._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Usage: ",7);
  if (program == (char *)0x0) {
    std::ios::clear((int)&local_1a8 + (int)*(_func_int **)(local_188._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(program);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,program,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188," -E <command> [arguments...]\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Available commands: \n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  capabilities              - Report capabilities built into cmake in JSON format\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  chdir dir cmd [args...]   - run command in a given directory\n"
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  compare_files [--ignore-eol] file1 file2\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "                              - check if file1 is same as file2\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  copy <file>... destination  - copy files to destination (either file or directory)\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  copy_directory <dir>... destination   - copy content of <dir>... directories to \'destination\' directory\n"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  copy_if_different <file>... destination  - copy files if it has changed\n",0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  echo [<string>...]        - displays arguments as text\n",0x39)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  echo_append [<string>...] - displays arguments as text but no new line\n",0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n",0x39)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "                            - run command in a modified environment\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  environment               - display the current environment\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  make_directory <dir>...   - create parent and <dir> directories\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  md5sum <file>...          - create MD5 checksum of files\n",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  sha1sum <file>...         - create SHA1 checksum of files\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  sha224sum <file>...       - create SHA224 checksum of files\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  sha256sum <file>...       - create SHA256 checksum of files\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  sha384sum <file>...       - create SHA384 checksum of files\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  sha512sum <file>...       - create SHA512 checksum of files\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  remove [-f] <file>...     - remove the file(s), use -f to force it\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  remove_directory <dir>... - remove directories and their contents\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  rename oldname newname    - rename a file or directory (on one volume)\n",0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  server                    - start cmake in server mode\n",0x39)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  sleep <number>...         - sleep for given number of seconds\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "                            - create or extract a tar or zip archive\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  time command [args...]    - run command and display elapsed time\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"  touch <file>...           - touch a <file>.\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  touch_nocreate <file>...  - touch a <file> but do not create it.\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "  create_symlink old new    - create a symbolic link new -> old\n",0x40);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return;
}

Assistant:

void CMakeCommandUsage(const char* program)
{
  std::ostringstream errorStream;

#ifdef CMAKE_BUILD_WITH_CMAKE
  /* clang-format off */
  errorStream
    << "cmake version " << cmVersion::GetCMakeVersion() << "\n";
/* clang-format on */
#else
  /* clang-format off */
  errorStream
    << "cmake bootstrap\n";
/* clang-format on */
#endif
  // If you add new commands, change here,
  // and in cmakemain.cxx in the options table
  /* clang-format off */
  errorStream
    << "Usage: " << program << " -E <command> [arguments...]\n"
    << "Available commands: \n"
    << "  capabilities              - Report capabilities built into cmake "
       "in JSON format\n"
    << "  chdir dir cmd [args...]   - run command in a given directory\n"
    << "  compare_files [--ignore-eol] file1 file2\n"
    << "                              - check if file1 is same as file2\n"
    << "  copy <file>... destination  - copy files to destination "
       "(either file or directory)\n"
    << "  copy_directory <dir>... destination   - copy content of <dir>... "
       "directories to 'destination' directory\n"
    << "  copy_if_different <file>... destination  - copy files if it has "
       "changed\n"
    << "  echo [<string>...]        - displays arguments as text\n"
    << "  echo_append [<string>...] - displays arguments as text but no new "
       "line\n"
    << "  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n"
    << "                            - run command in a modified environment\n"
    << "  environment               - display the current environment\n"
    << "  make_directory <dir>...   - create parent and <dir> directories\n"
    << "  md5sum <file>...          - create MD5 checksum of files\n"
    << "  sha1sum <file>...         - create SHA1 checksum of files\n"
    << "  sha224sum <file>...       - create SHA224 checksum of files\n"
    << "  sha256sum <file>...       - create SHA256 checksum of files\n"
    << "  sha384sum <file>...       - create SHA384 checksum of files\n"
    << "  sha512sum <file>...       - create SHA512 checksum of files\n"
    << "  remove [-f] <file>...     - remove the file(s), use -f to force "
       "it\n"
    << "  remove_directory <dir>... - remove directories and their contents\n"
    << "  rename oldname newname    - rename a file or directory "
       "(on one volume)\n"
    << "  server                    - start cmake in server mode\n"
    << "  sleep <number>...         - sleep for given number of seconds\n"
    << "  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n"
    << "                            - create or extract a tar or zip archive\n"
    << "  time command [args...]    - run command and display elapsed time\n"
    << "  touch <file>...           - touch a <file>.\n"
    << "  touch_nocreate <file>...  - touch a <file> but do not create it.\n"
    << "  create_symlink old new    - create a symbolic link new -> old\n"
#if defined(_WIN32) && !defined(__CYGWIN__)
    << "Available on Windows only:\n"
    << "  delete_regv key           - delete registry value\n"
    << "  env_vs8_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2005\n"
    << "  env_vs9_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2008\n"
    << "  write_regv key value      - write registry value\n"
#endif
    ;
  /* clang-format on */

  cmSystemTools::Error(errorStream.str());
}